

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.c
# Opt level: O2

long get_ia(void)

{
  rand_gen *prVar1;
  long lVar2;
  double dVar3;
  
  prVar1 = cfg->idist;
  if (prVar1->generate == (_func_double_rand_gen_ptr *)0x0) {
    dVar3 = drand48();
    dVar3 = (*prVar1->inv_cdf)(prVar1,dVar3);
  }
  else {
    dVar3 = (*prVar1->generate)(prVar1);
  }
  lVar2 = lround(dVar3 * 1000.0);
  return lVar2;
}

Assistant:

long get_ia(void)
{
	return lround(generate(cfg->idist) * 1000);
}